

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  int iVar1;
  SimpleString *pSVar2;
  size_t sVar3;
  size_t n;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  char *in_RDX;
  char *in_RSI;
  SimpleString *in_RDI;
  size_t j;
  size_t i;
  char *newbuf;
  size_t newsize;
  size_t withlen;
  size_t tolen;
  size_t len;
  size_t c;
  char *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  SimpleString *this_00;
  SimpleString *in_stack_ffffffffffffffa0;
  long lVar7;
  ulong local_58;
  
  SimpleString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pSVar2 = (SimpleString *)count(in_stack_ffffffffffffffa0,in_RDI);
  ~SimpleString((SimpleString *)0x20b15a);
  this_00 = pSVar2;
  sVar3 = size((SimpleString *)0x20b16e);
  n = StrLen(in_RSI);
  sVar4 = StrLen(in_RDX);
  lVar5 = (sVar3 + sVar4 * (long)pSVar2) - n * (long)pSVar2;
  if (lVar5 + 1U < 2) {
    deallocStringBuffer((char *)this_00,in_stack_ffffffffffffff88,0);
    pcVar6 = getEmptyString(this_00);
    in_RDI->buffer_ = pcVar6;
  }
  else {
    pcVar6 = allocStringBuffer((size_t)this_00,in_stack_ffffffffffffff88,0);
    local_58 = 0;
    lVar7 = 0;
    while (local_58 < sVar3) {
      iVar1 = StrNCmp(in_RDI->buffer_ + local_58,in_RSI,n);
      if (iVar1 == 0) {
        StrNCpy(pcVar6 + lVar7,in_RDX,sVar4 + 1);
        lVar7 = sVar4 + lVar7;
        local_58 = n + local_58;
      }
      else {
        pcVar6[lVar7] = in_RDI->buffer_[local_58];
        lVar7 = lVar7 + 1;
        local_58 = local_58 + 1;
      }
    }
    deallocStringBuffer((char *)this_00,in_stack_ffffffffffffff88,0);
    in_RDI->buffer_ = pcVar6;
    in_RDI->buffer_[lVar5] = '\0';
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&buffer_[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = buffer_[i];
                j++;
                i++;
            }
        }
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = newbuf;
        buffer_[newsize - 1] = '\0';
    }
    else {
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = getEmptyString();
    }
}